

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int statement(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  node_t pvVar2;
  socklen_t *__addr_len;
  socklen_t *__addr_len_00;
  uint uVar3;
  sockaddr *in_RSI;
  
  iVar1 = compound_statement();
  uVar3 = 1;
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = accept(0x83,in_RSI,__addr_len);
  if (iVar1 == 0) {
LAB_00105a85:
    pvVar2 = assignment_expression();
    if (pvVar2 == (node_t)0x0) {
      iVar1 = accept(0x3b,in_RSI,__addr_len_00);
    }
    else {
      iVar1 = expect(0x3b);
      if (iVar1 != 0) goto LAB_00105aa1;
      sync();
      iVar1 = extraout_EAX_00;
    }
    uVar3 = (uint)(iVar1 != 0);
  }
  else {
    pvVar2 = assignment_expression();
    iVar1 = expect(0x3b);
    if (iVar1 == 0) {
      sync();
      if (extraout_EAX != 0) {
        return 1;
      }
      goto LAB_00105a85;
    }
    pvVar2 = jump(0x83,pvVar2);
LAB_00105aa1:
    ast_add_node(pvVar2);
  }
  return uVar3;
}

Assistant:

int statement()
{
    if (compound_statement())
        return 1;
    else if (jump_statement())
        return 1;
    /* expression_statement() has to be the last in the list, as in case of
       error it will try to resync on a ";" and yield true if synced, making the
       statement an empty statement and allowing the parsing to continue */
    else if (expression_statement())
        return 1;

    return 0;
}